

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O3

void pnga_summarize(Integer verbose)

{
  bool bVar1;
  ulong uVar2;
  Integer IVar3;
  long lVar4;
  char *pcVar5;
  ulong proc;
  ulong g_a;
  Integer ndim;
  char *name;
  Integer type;
  Integer hip [7];
  Integer lop [7];
  Integer dims [7];
  long local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  char *local_f8;
  Integer local_f0;
  Integer local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  uVar2 = pnga_nnodes();
  fwrite(" Summary of allocated global arrays\n",0x24,1,_stdout);
  fwrite("-----------------------------------\n",0x24,1,_stdout);
  g_a = 0xfffffffffffffc18;
  local_118 = 0;
  bVar1 = false;
  local_100 = uVar2;
  do {
    IVar3 = pnga_verify_handle(g_a);
    if (IVar3 == 1) {
      pnga_inquire(g_a,&local_f0,&local_110,local_68);
      pnga_inquire_name(g_a,&local_f8);
      local_108 = g_a;
      switch(local_f0) {
      case 0x3e9:
        pcVar5 = "  array %d => integer ";
        break;
      case 0x3ea:
        pcVar5 = "  array %d => long ";
        break;
      case 0x3eb:
        pcVar5 = "  array %d => float ";
        break;
      case 0x3ec:
        pcVar5 = "  array %d => double precision ";
        break;
      default:
        pnga_error("ga_print: wrong type",0);
        goto LAB_0012701e;
      case 0x3ee:
        pcVar5 = "  array %d => float (single) complex ";
        break;
      case 0x3ef:
        pcVar5 = "  array %d => double complex ";
        break;
      case 0x3f8:
        pcVar5 = "  array %d => long long";
      }
      fprintf(_stdout,pcVar5,local_118);
LAB_0012701e:
      fprintf(_stdout,"%s(",local_f8);
      if (0 < local_110) {
        lVar4 = 0;
        do {
          pcVar5 = "%ld,";
          if (lVar4 == local_110 + -1) {
            pcVar5 = "%ld";
          }
          fprintf(_stdout,pcVar5,local_68[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < local_110);
      }
      g_a = local_108;
      local_118 = local_118 + 1;
      fprintf(_stdout,"),  handle: %d \n",local_108 & 0xffffffff);
      bVar1 = true;
      if (0 < (long)uVar2 && verbose != 0) {
        proc = 0;
        do {
          pnga_distribution(g_a,proc,local_a8,local_e8);
          fwrite("    (",5,1,_stdout);
          if (0 < local_110) {
            lVar4 = 0;
            do {
              pcVar5 = "%ld:%ld,";
              if (lVar4 == local_110 + -1) {
                pcVar5 = "%ld:%ld";
              }
              fprintf(_stdout,pcVar5,local_a8[lVar4],local_e8[lVar4]);
              lVar4 = lVar4 + 1;
            } while (lVar4 < local_110);
          }
          fprintf(_stdout,") -> %d \n",proc & 0xffffffff);
          proc = proc + 1;
        } while (proc != local_100);
        bVar1 = true;
      }
    }
    g_a = g_a + 1;
    if (g_a == 0xfffffffffffffc7c) {
      if (!bVar1) {
        fwrite("  No active global arrays\n",0x1a,1,_stdout);
      }
      fwrite("\n\n",2,1,_stdout);
      fflush(_stdout);
      return;
    }
  } while( true );
}

Assistant:

void pnga_summarize(Integer verbose)
{
#define DEV stdout
    
    Integer i, j, g_a;
    Integer printed, arr_no;
    Integer type, active;
    char *name;
    Integer ndim, dims[MAXDIM];
    Integer lop[MAXDIM], hip[MAXDIM];
    Integer nproc = pnga_nnodes();
    
    fprintf(DEV, " Summary of allocated global arrays\n");
    fprintf(DEV, "-----------------------------------\n");

    printed = 0;
    arr_no = 0;
    
    for(g_a=-1000; g_a<-900; g_a++) {
        active = pnga_verify_handle(g_a);

        if(active == 1) {
            printed = 1;
            pnga_inquire(g_a, &type, &ndim, dims);
            pnga_inquire_name(g_a, &name);
            
            switch(type) {
                case C_INT:
                    fprintf(DEV, "  array %d => integer ", (int)arr_no);
                    break;
                case C_DBL:
                    fprintf(DEV, "  array %d => double precision ",(int)arr_no);
                    break;
                case C_DCPL:
                    fprintf(DEV, "  array %d => double complex ", (int)arr_no);
                    break;
                case C_SCPL:
                    fprintf(DEV, "  array %d => float (single) complex ", (int)arr_no);
                    break;
                case C_FLOAT:
                    fprintf(DEV, "  array %d => float ",(int)arr_no);
                    break;       
                case C_LONG:
                    fprintf(DEV, "  array %d => long ",(int)arr_no);
                    break;   
                case C_LONGLONG:
                    fprintf(DEV, "  array %d => long long",(int)arr_no);
                    break;   
                default: pnga_error("ga_print: wrong type",0);
            }
            arr_no++;

            fprintf(DEV,"%s(", name);
            for(i=0; i<ndim; i++)
                if(i != (ndim-1)) fprintf(DEV, "%ld,", (long)dims[i]);
                else fprintf(DEV, "%ld", (long)dims[i]);
            fprintf(DEV,"),  handle: %d \n",(int) g_a);

            if(verbose) {
                for(i=0; i<nproc; i++){
                    pnga_distribution(g_a, i, lop, hip);
                    
                    fprintf(DEV,"    (");
                    for(j=0; j<ndim; j++)
                        if(j != (ndim-1))
                            fprintf(DEV, "%ld:%ld,",(long)lop[j], (long)hip[j]);
                        else
                            fprintf(DEV, "%ld:%ld", (long)lop[j], (long)hip[j]);
                    fprintf(DEV,") -> %d \n",(int) i);
                }
            }
        }
    }

    if(!printed) fprintf(DEV, "  No active global arrays\n");

    fprintf(DEV, "\n\n");
    fflush(DEV);
}